

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<float>::Insert_Leaf(BpTree<float> *this,IndexNode<float> *C,float k,Addr p)

{
  float *pfVar1;
  pointer pcVar2;
  pointer pfVar3;
  pointer pAVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  IndexNode<float> local_80;
  
  IndexNode<float>::IndexNode(&local_80,C);
  Buffer::Lock(&blocks,local_80.self.BlockNum);
  IndexNode<float>::~IndexNode(&local_80);
  pcVar2 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = 0;
  uVar5 = (ulong)(uint)this->N;
  if (this->N < 1) {
    uVar5 = uVar7;
  }
  for (; (uVar8 = uVar5, uVar5 != uVar7 && (uVar8 = uVar7, pcVar2[uVar7] == '1')); uVar7 = uVar7 + 1
      ) {
  }
  uVar7 = 0;
  do {
    if (uVar5 == uVar7) {
LAB_0012e411:
      lVar6 = (long)(int)uVar5;
      for (uVar8 = uVar8 & 0xffffffff; lVar6 < (long)uVar8; uVar8 = uVar8 - 1) {
        pcVar2 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2[uVar8] = pcVar2[uVar8 - 1];
        pfVar3 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar3[uVar8] = pfVar3[uVar8 - 1];
        pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[uVar8] = pAVar4[uVar8 - 1];
      }
      (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = k;
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = p;
      (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = '1';
      return;
    }
    if ((pcVar2[uVar7] != '1') ||
       (pfVar1 = (C->k).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7, k < *pfVar1 || k == *pfVar1)) {
      uVar5 = uVar7 & 0xffffffff;
      goto LAB_0012e411;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}